

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_internal.h
# Opt level: O2

block_size_descriptor * aligned_malloc<block_size_descriptor>(size_t size,size_t align)

{
  int iVar1;
  void *in_RAX;
  void *ptr;
  
  if (align < 0x21) {
    align = 0x20;
  }
  ptr = in_RAX;
  iVar1 = posix_memalign(&ptr,align,size);
  if (iVar1 != 0) {
    ptr = (block_size_descriptor *)0x0;
  }
  return (block_size_descriptor *)ptr;
}

Assistant:

T* aligned_malloc(size_t size, size_t align)
{
	void* ptr;
	int error = 0;

	// Don't allow this to under-align a type
	size_t min_align = astc::max(alignof(T), sizeof(void*));
	size_t real_align = astc::max(min_align, align);

#if defined(_WIN32)
	ptr = _aligned_malloc(size, real_align);
#else
	error = posix_memalign(&ptr, real_align, size);
#endif

	if (error || (!ptr))
	{
		return nullptr;
	}

	return static_cast<T*>(ptr);
}